

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
DynamicHistogram<double>::cdf
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DynamicHistogram<double> *this)

{
  double *pdVar1;
  int iVar2;
  double *pdVar3;
  runtime_error *this_00;
  double dVar4;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])(this);
  if ((char)iVar2 != '\0') {
    pdf(__return_storage_ptr__,this);
    pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar1) {
      dVar4 = 0.0;
      do {
        dVar4 = dVar4 + *pdVar3;
        *pdVar3 = dVar4;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::cdf - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<double>
    cdf()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::cdf - Histogram could not be initialized.");

        std::vector<double> prob = this->pdf();

        double sum = 0;
        for (std::vector<double>::iterator it = prob.begin(); it != prob.end(); ++it)
        {
            *it += sum;
            sum = *it;
        }

        return prob;

    }